

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O2

bool embree::avx512::InstanceIntersector1MB::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,InstancePrimitive *prim)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  Instance *pIVar9;
  RTCRayQueryContext *pRVar10;
  long lVar11;
  float fVar12;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar13;
  undefined8 uVar14;
  byte bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  bool bVar24;
  uint uVar25;
  uint uVar26;
  AffineSpace3ff *pAVar27;
  int iVar28;
  undefined8 unaff_R13;
  AffineSpace3ff *pAVar29;
  uint uVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar31;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined4 uVar47;
  vfloat4 a0_2;
  undefined1 auVar49 [16];
  float fVar48;
  undefined1 auVar50 [16];
  vfloat4 a0;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  vfloat4 a0_1;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar65;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  vfloat4 b0;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  vfloat4 a1;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  RayQueryContext newcontext;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  
  pIVar9 = prim->instance;
  if (((ray->mask & (pIVar9->super_Geometry).mask) == 0) ||
     (pRVar10 = context->user, pRVar10->instID[0] != 0xffffffff)) {
    bVar24 = false;
  }
  else {
    pRVar10->instID[0] = prim->instID_;
    pRVar10->instPrimID[0] = 0;
    if ((pIVar9->super_Geometry).numTimeSteps == 1) {
      aVar6 = (pIVar9->world2local0).l.vx.field_0;
      aVar7 = (pIVar9->world2local0).l.vy.field_0;
      aVar8 = (pIVar9->world2local0).l.vz.field_0;
      aVar32 = (pIVar9->world2local0).p.field_0;
    }
    else {
      fVar48 = (pIVar9->super_Geometry).fnumTimeSegments;
      fVar65 = (pIVar9->super_Geometry).time_range.lower;
      fVar65 = fVar48 * (((ray->dir).field_0.m128[3] - fVar65) /
                        ((pIVar9->super_Geometry).time_range.upper - fVar65));
      auVar34 = vroundss_avx(ZEXT416((uint)fVar65),ZEXT416((uint)fVar65),9);
      auVar34 = vminss_avx(auVar34,ZEXT416((uint)(fVar48 + -1.0)));
      auVar35._0_12_ = ZEXT812(0);
      auVar35._12_4_ = 0;
      auVar34 = vmaxss_avx(auVar35,auVar34);
      fVar65 = fVar65 - auVar34._0_4_;
      iVar28 = (int)auVar34._0_4_;
      pAVar27 = pIVar9->local2world + CONCAT44((int)((ulong)unaff_R13 >> 0x20),iVar28);
      pAVar29 = pIVar9->local2world + (iVar28 + 1);
      if ((pIVar9->super_Geometry).field_8.field_0x1 == '\x01') {
        uVar25 = *(uint *)((long)&(pAVar27->p).field_0 + 0xc);
        uVar1 = *(uint *)((long)&(pAVar27->l).vx.field_0 + 0xc);
        uVar2 = *(uint *)((long)&(pAVar27->l).vy.field_0 + 0xc);
        uVar3 = *(uint *)((long)&(pAVar27->l).vz.field_0 + 0xc);
        uVar26 = *(uint *)((long)&(pAVar29->p).field_0 + 0xc);
        uVar30 = *(uint *)((long)&(pAVar29->l).vx.field_0 + 0xc);
        uVar4 = *(uint *)((long)&(pAVar29->l).vy.field_0 + 0xc);
        uVar5 = *(uint *)((long)&(pAVar29->l).vz.field_0 + 0xc);
        auVar34 = vmulss_avx512f(ZEXT416(uVar1),ZEXT416(uVar30));
        auVar34 = vfmadd231ss_avx512f(auVar34,ZEXT416(uVar25),ZEXT416(uVar26));
        auVar34 = vfmadd231ss_avx512f(auVar34,ZEXT416(uVar2),ZEXT416(uVar4));
        auVar35 = vfmadd231ss_avx512f(auVar34,ZEXT416(uVar3),ZEXT416(uVar5));
        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar34 = vxorps_avx512vl(auVar35,auVar36);
        bVar24 = auVar35._0_4_ < auVar34._0_4_;
        auVar33 = vxorps_avx512vl(ZEXT416(uVar26),auVar36);
        auVar37 = vxorps_avx512vl(ZEXT416(uVar30),auVar36);
        auVar38 = vxorps_avx512vl(ZEXT416(uVar4),auVar36);
        auVar39 = vxorps_avx512vl(ZEXT416(uVar5),auVar36);
        auVar33 = ZEXT416((uint)bVar24 * auVar33._0_4_ + !bVar24 * uVar26);
        auVar37 = ZEXT416((uint)bVar24 * auVar37._0_4_ + !bVar24 * uVar30);
        auVar38 = ZEXT416((uint)bVar24 * auVar38._0_4_ + !bVar24 * uVar4);
        auVar39 = ZEXT416((uint)bVar24 * auVar39._0_4_ + !bVar24 * uVar5);
        auVar40 = vmaxss_avx512f(auVar34,auVar35);
        auVar34._8_4_ = 0x7fffffff;
        auVar34._0_8_ = 0x7fffffff7fffffff;
        auVar34._12_4_ = 0x7fffffff;
        auVar35 = vandps_avx512vl(auVar35,auVar34);
        auVar34 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbb8d3753),0),auVar35,ZEXT416(0x3c9df1b8));
        auVar34 = vfmadd213ss_fma(auVar34,auVar35,ZEXT416(0xbd37e81c));
        auVar34 = vfmadd213ss_fma(auVar34,auVar35,ZEXT416(0x3db3edac));
        auVar34 = vfmadd213ss_fma(auVar34,auVar35,ZEXT416(0xbe5ba881));
        auVar34 = vfmadd213ss_fma(auVar34,auVar35,ZEXT416(0x3fc90fd1));
        auVar41 = vsubss_avx512f(ZEXT416(0x3f800000),auVar35);
        if (auVar41._0_4_ < 0.0) {
          fVar48 = sqrtf(auVar41._0_4_);
          auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar40 = ZEXT416(auVar40._0_4_);
        }
        else {
          auVar41 = vsqrtss_avx(auVar41,auVar41);
          fVar48 = auVar41._0_4_;
        }
        auVar45 = ZEXT416(uVar25);
        auVar46 = ZEXT416(0x3f800000);
        auVar44 = ZEXT416((uint)fVar65);
        auVar34 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(1.5707964 - fVar48 * auVar34._0_4_)))
        ;
        auVar41 = vxorps_avx512vl(auVar34,auVar36);
        uVar14 = vcmpss_avx512f(auVar40,ZEXT816(0) << 0x40,1);
        bVar24 = (bool)((byte)uVar14 & 1);
        uVar14 = vcmpss_avx512f(auVar46,auVar35,1);
        bVar16 = (bool)((byte)uVar14 & 1);
        fVar48 = fVar65 * (float)((uint)bVar16 * 0x7fc00000 +
                                 (uint)!bVar16 *
                                 (int)(1.5707964 -
                                      (float)((uint)bVar24 * auVar41._0_4_ +
                                             (uint)!bVar24 * auVar34._0_4_)));
        auVar34 = ZEXT416((uint)(fVar48 * 0.63661975));
        auVar34 = vroundss_avx(auVar34,auVar34,9);
        auVar35 = vfnmadd213ss_fma(SUB6416(ZEXT464(0x3fc90fdb),0),auVar34,ZEXT416((uint)fVar48));
        uVar25 = (int)auVar34._0_4_ & 3;
        uVar26 = uVar25 - 1;
        fVar31 = auVar35._0_4_;
        fVar48 = fVar31 * fVar31;
        auVar35 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb2d70013),0),ZEXT416((uint)fVar48),
                                  ZEXT416(0x363938a8));
        auVar41 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb48b634d),0),ZEXT416((uint)fVar48),
                                  ZEXT416(0x37cfab9c));
        auVar50 = ZEXT416((uint)fVar48);
        auVar35 = vfmadd213ss_fma(auVar35,auVar50,ZEXT416(0xb9501096));
        auVar41 = vfmadd213ss_fma(auVar41,auVar50,ZEXT416(0xbab60981));
        auVar35 = vfmadd213ss_fma(auVar35,auVar50,ZEXT416(0x3c088898));
        auVar41 = vfmadd213ss_fma(auVar41,auVar50,ZEXT416(0x3d2aaaa4));
        auVar50 = ZEXT416((uint)fVar48);
        auVar35 = vfmadd213ss_fma(auVar35,auVar50,ZEXT416(0xbe2aaaab));
        auVar41 = vfmadd213ss_fma(auVar41,auVar50,SUB6416(ZEXT464(0xbf000000),0));
        auVar35 = vfmadd213ss_avx512f(auVar35,auVar50,auVar46);
        auVar41 = vfmadd213ss_avx512f(auVar41,auVar50,auVar46);
        fVar31 = fVar31 * auVar35._0_4_;
        bVar15 = (byte)(int)auVar34._0_4_;
        uVar30 = (uint)(bVar15 & 1) * auVar41._0_4_ + (uint)!(bool)(bVar15 & 1) * (int)fVar31;
        auVar41._0_4_ = (uint)(bVar15 & 1) * (int)fVar31 + (uint)!(bool)(bVar15 & 1) * auVar41._0_4_
        ;
        auVar34 = vxorps_avx512vl(auVar41,auVar36);
        auVar43._0_4_ = (uint)(uVar26 < 2) * auVar34._0_4_ + (uint)(uVar26 >= 2) * auVar41._0_4_;
        auVar43._4_12_ = auVar41._4_12_;
        auVar35 = vfmsub213ss_avx512f(auVar45,auVar40,auVar33);
        auVar34 = vfmsub213ss_avx512f(ZEXT416(uVar1),auVar40,auVar37);
        auVar41 = vfmsub213ss_avx512f(ZEXT416(uVar2),auVar40,auVar38);
        auVar40 = vfmsub213ss_avx512f(ZEXT416(uVar3),auVar40,auVar39);
        fVar58 = auVar34._0_4_;
        auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar58 * fVar58)),auVar35,auVar35);
        auVar34 = vfmadd231ss_fma(auVar34,auVar41,auVar41);
        auVar34 = vfmadd231ss_fma(auVar34,auVar40,auVar40);
        auVar50._12_4_ = 0;
        auVar50._0_12_ = ZEXT812(0);
        auVar50 = auVar50 << 0x20;
        auVar42 = vrsqrt14ss_avx512f(auVar50,ZEXT416((uint)auVar34._0_4_));
        fVar48 = auVar42._0_4_;
        fVar48 = fVar48 * 1.5 + fVar48 * fVar48 * fVar48 * auVar34._0_4_ * -0.5;
        auVar34 = vxorps_avx512vl(ZEXT416(uVar30),auVar36);
        fVar31 = (float)((1 < uVar25) * uVar30 + (uint)(1 >= uVar25) * auVar34._0_4_);
        auVar36 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar31 * fVar48 * auVar35._0_4_)),auVar43,
                                      auVar45);
        auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar31 * fVar48 * fVar58)),auVar43,ZEXT416(uVar1));
        auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar48 * auVar41._0_4_ * fVar31)),auVar43,
                                  ZEXT416(uVar2));
        auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar31 * fVar48 * auVar40._0_4_)),ZEXT416(uVar3),
                                  auVar43);
        auVar41 = vsubss_avx512f(auVar46,auVar44);
        auVar33 = vmulss_avx512f(auVar44,auVar33);
        auVar43 = vfmadd231ss_avx512f(auVar33,auVar41,auVar45);
        auVar33 = vmulss_avx512f(auVar44,auVar37);
        auVar33 = vfmadd231ss_fma(auVar33,auVar41,ZEXT416(uVar1));
        auVar37 = vmulss_avx512f(auVar44,auVar38);
        auVar37 = vfmadd231ss_fma(auVar37,auVar41,ZEXT416(uVar2));
        auVar38 = vmulss_avx512f(auVar44,auVar39);
        auVar38 = vfmadd231ss_fma(auVar38,auVar41,ZEXT416(uVar3));
        fVar31 = auVar33._0_4_;
        auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar31 * fVar31)),auVar43,auVar43);
        auVar33 = vfmadd231ss_fma(auVar33,auVar37,auVar37);
        auVar33 = vfmadd231ss_fma(auVar33,auVar38,auVar38);
        auVar39 = vrsqrt14ss_avx512f(auVar50,ZEXT416((uint)auVar33._0_4_));
        fVar48 = auVar39._0_4_;
        fVar48 = fVar48 * 1.5 + fVar48 * fVar48 * fVar48 * auVar33._0_4_ * -0.5;
        vucomiss_avx512f(ZEXT416(0x3f7fdf3b));
        bVar24 = 2 < uVar26;
        auVar36._0_4_ =
             (float)((uint)bVar24 * (int)(auVar43._0_4_ * fVar48) + (uint)!bVar24 * auVar36._0_4_);
        auVar42._4_12_ = auVar34._4_12_;
        auVar42._0_4_ =
             (float)((uint)bVar24 * (int)(fVar31 * fVar48) + (uint)!bVar24 * auVar34._0_4_);
        auVar44._4_12_ = auVar35._4_12_;
        auVar44._0_4_ =
             (float)((uint)bVar24 * (int)(auVar37._0_4_ * fVar48) + (uint)!bVar24 * auVar35._0_4_);
        auVar45._4_12_ = auVar40._4_12_;
        auVar45._0_4_ =
             (float)((uint)bVar24 * (int)(auVar38._0_4_ * fVar48) + (uint)!bVar24 * auVar40._0_4_);
        auVar73._0_4_ = fVar65 * (pAVar29->l).vx.field_0.m128[0];
        auVar73._4_4_ = fVar65 * (pAVar29->l).vx.field_0.m128[1];
        auVar73._8_4_ = fVar65 * (pAVar29->l).vx.field_0.m128[2];
        auVar73._12_4_ = fVar65 * (pAVar29->l).vx.field_0.m128[3];
        uVar47 = auVar41._0_4_;
        auVar75._4_4_ = uVar47;
        auVar75._0_4_ = uVar47;
        auVar75._8_4_ = uVar47;
        auVar75._12_4_ = uVar47;
        auVar35 = vfmadd231ps_fma(auVar73,auVar75,(undefined1  [16])(pAVar27->l).vx.field_0);
        auVar71._0_4_ = fVar65 * (pAVar29->l).vy.field_0.m128[0];
        auVar71._4_4_ = fVar65 * (pAVar29->l).vy.field_0.m128[1];
        auVar71._8_4_ = fVar65 * (pAVar29->l).vy.field_0.m128[2];
        auVar71._12_4_ = fVar65 * (pAVar29->l).vy.field_0.m128[3];
        auVar33 = vfmadd231ps_fma(auVar71,auVar75,(undefined1  [16])(pAVar27->l).vy.field_0);
        auVar69._0_4_ = fVar65 * (pAVar29->l).vz.field_0.m128[0];
        auVar69._4_4_ = fVar65 * (pAVar29->l).vz.field_0.m128[1];
        auVar69._8_4_ = fVar65 * (pAVar29->l).vz.field_0.m128[2];
        auVar69._12_4_ = fVar65 * (pAVar29->l).vz.field_0.m128[3];
        auVar37 = vfmadd231ps_fma(auVar69,auVar75,(undefined1  [16])(pAVar27->l).vz.field_0);
        auVar67._0_4_ = fVar65 * (pAVar29->p).field_0.m128[0];
        auVar67._4_4_ = fVar65 * (pAVar29->p).field_0.m128[1];
        auVar67._8_4_ = fVar65 * (pAVar29->p).field_0.m128[2];
        auVar67._12_4_ = fVar65 * (pAVar29->p).field_0.m128[3];
        auVar40 = vfmadd231ps_fma(auVar67,auVar75,(undefined1  [16])(pAVar27->p).field_0);
        auVar34 = vshufps_avx(auVar35,auVar50,0xe9);
        auVar34 = vblendps_avx(auVar34,auVar33,4);
        auVar38 = vfmadd213ss_fma(auVar36,auVar36,ZEXT416((uint)(auVar42._0_4_ * auVar42._0_4_)));
        auVar38 = vfnmadd231ss_fma(auVar38,auVar44,auVar44);
        auVar41 = vfnmadd231ss_fma(auVar38,auVar45,auVar45);
        auVar38 = vfmadd213ss_fma(auVar44,auVar42,ZEXT416((uint)(auVar36._0_4_ * auVar45._0_4_)));
        fVar48 = auVar38._0_4_ + auVar38._0_4_;
        auVar38 = vfmsub213ss_fma(auVar45,auVar42,ZEXT416((uint)(auVar36._0_4_ * auVar44._0_4_)));
        fVar65 = auVar38._0_4_ + auVar38._0_4_;
        auVar38 = vfmsub231ss_fma(ZEXT416((uint)(auVar36._0_4_ * auVar45._0_4_)),auVar42,auVar44);
        fVar31 = auVar38._0_4_ + auVar38._0_4_;
        auVar39 = vfmsub231ss_fma(ZEXT416((uint)(auVar42._0_4_ * auVar42._0_4_)),auVar36,auVar36);
        auVar38 = vfmadd213ss_avx512f(auVar44,auVar44,auVar39);
        auVar43 = vfnmadd231ss_avx512f(auVar38,auVar45,auVar45);
        auVar38 = vfmadd213ss_avx512f(auVar45,auVar44,ZEXT416((uint)(auVar36._0_4_ * auVar42._0_4_))
                                     );
        auVar46 = vaddss_avx512f(auVar38,auVar38);
        auVar38 = vfmadd213ss_fma(auVar42,auVar45,ZEXT416((uint)(auVar36._0_4_ * auVar44._0_4_)));
        fVar58 = auVar38._0_4_ + auVar38._0_4_;
        auVar38 = vfmsub231ss_fma(ZEXT416((uint)(auVar36._0_4_ * auVar42._0_4_)),auVar44,auVar45);
        fVar12 = auVar38._0_4_ + auVar38._0_4_;
        auVar38 = vfnmadd231ss_fma(auVar39,auVar44,auVar44);
        auVar39 = vfmadd231ss_fma(auVar38,auVar45,auVar45);
        uVar47 = auVar41._0_4_;
        auVar53._4_4_ = uVar47;
        auVar53._0_4_ = uVar47;
        auVar53._8_4_ = uVar47;
        auVar53._12_4_ = uVar47;
        auVar38._4_4_ = fVar48;
        auVar38._0_4_ = fVar48;
        auVar38._8_4_ = fVar48;
        auVar38._12_4_ = fVar48;
        auVar77._0_4_ = fVar65 * 0.0;
        auVar77._4_4_ = fVar65 * 0.0;
        auVar77._8_4_ = fVar65 * 1.0;
        auVar77._12_4_ = fVar65 * 0.0;
        auVar42 = ZEXT816(0x3f80000000000000);
        auVar38 = vfmadd231ps_fma(auVar77,auVar42,auVar38);
        auVar44 = SUB6416(ZEXT464(0x3f800000),0);
        auVar41 = vfmadd231ps_fma(auVar38,auVar44,auVar53);
        auVar54._4_4_ = fVar31;
        auVar54._0_4_ = fVar31;
        auVar54._8_4_ = fVar31;
        auVar54._12_4_ = fVar31;
        auVar38 = vbroadcastss_avx512vl(auVar43);
        auVar36 = vbroadcastss_avx512vl(auVar46);
        auVar76._0_4_ = auVar36._0_4_ * 0.0;
        auVar76._4_4_ = auVar36._4_4_ * 0.0;
        auVar76._8_4_ = auVar36._8_4_ * 1.0;
        auVar76._12_4_ = auVar36._12_4_ * 0.0;
        auVar38 = vfmadd231ps_fma(auVar76,auVar42,auVar38);
        auVar36 = vfmadd231ps_fma(auVar38,auVar44,auVar54);
        auVar46._4_4_ = fVar58;
        auVar46._0_4_ = fVar58;
        auVar46._8_4_ = fVar58;
        auVar46._12_4_ = fVar58;
        auVar57._4_4_ = fVar12;
        auVar57._0_4_ = fVar12;
        auVar57._8_4_ = fVar12;
        auVar57._12_4_ = fVar12;
        fVar48 = auVar39._0_4_;
        auVar64._0_4_ = fVar48 * 0.0;
        auVar64._4_4_ = fVar48 * 0.0;
        auVar64._8_4_ = fVar48 * 1.0;
        auVar64._12_4_ = fVar48 * 0.0;
        auVar38 = vfmadd231ps_fma(auVar64,auVar42,auVar57);
        auVar38 = vfmadd231ps_fma(auVar38,auVar44,auVar46);
        uVar47 = auVar35._0_4_;
        auVar39._4_4_ = uVar47;
        auVar39._0_4_ = uVar47;
        auVar39._8_4_ = uVar47;
        auVar39._12_4_ = uVar47;
        fVar48 = auVar38._0_4_;
        auVar60._0_4_ = fVar48 * 0.0;
        fVar65 = auVar38._4_4_;
        auVar60._4_4_ = fVar65 * 0.0;
        fVar31 = auVar38._8_4_;
        auVar60._8_4_ = fVar31 * 0.0;
        fVar58 = auVar38._12_4_;
        auVar60._12_4_ = fVar58 * 0.0;
        auVar35 = vfmadd213ps_fma(auVar50,auVar36,auVar60);
        auVar39 = vfmadd231ps_fma(auVar35,auVar41,auVar39);
        uVar47 = auVar33._0_4_;
        auVar74._4_4_ = uVar47;
        auVar74._0_4_ = uVar47;
        auVar74._8_4_ = uVar47;
        auVar74._12_4_ = uVar47;
        auVar35 = vshufps_avx(auVar33,auVar33,0x55);
        auVar35 = vfmadd213ps_fma(auVar35,auVar36,auVar60);
        auVar38 = vfmadd231ps_fma(auVar35,auVar41,auVar74);
        uVar47 = auVar37._0_4_;
        auVar72._4_4_ = uVar47;
        auVar72._0_4_ = uVar47;
        auVar72._8_4_ = uVar47;
        auVar72._12_4_ = uVar47;
        auVar35 = vshufps_avx(auVar37,auVar37,0x55);
        auVar33 = vshufps_avx(auVar37,auVar37,0xaa);
        auVar37._0_4_ = auVar33._0_4_ * fVar48;
        auVar37._4_4_ = auVar33._4_4_ * fVar65;
        auVar37._8_4_ = auVar33._8_4_ * fVar31;
        auVar37._12_4_ = auVar33._12_4_ * fVar58;
        auVar35 = vfmadd231ps_fma(auVar37,auVar36,auVar35);
        auVar37 = vfmadd231ps_fma(auVar35,auVar41,auVar72);
        uVar47 = auVar40._0_4_;
        auVar70._4_4_ = uVar47;
        auVar70._0_4_ = uVar47;
        auVar70._8_4_ = uVar47;
        auVar70._12_4_ = uVar47;
        auVar35 = vshufps_avx(auVar40,auVar40,0x55);
        auVar33 = vshufps_avx(auVar40,auVar40,0xaa);
        auVar40._0_4_ = auVar33._0_4_ * fVar48;
        auVar40._4_4_ = auVar33._4_4_ * fVar65;
        auVar40._8_4_ = auVar33._8_4_ * fVar31;
        auVar40._12_4_ = auVar33._12_4_ * fVar58;
        auVar35 = vfmadd231ps_fma(auVar40,auVar36,auVar35);
        auVar35 = vfmadd231ps_fma(auVar35,auVar41,auVar70);
        auVar33._0_4_ = auVar34._0_4_ + 0.0 + auVar35._0_4_;
        auVar33._4_4_ = auVar34._4_4_ + 0.0 + auVar35._4_4_;
        auVar33._8_4_ = auVar34._8_4_ + 0.0 + auVar35._8_4_;
        auVar33._12_4_ = auVar34._12_4_ + 0.0 + auVar35._12_4_;
      }
      else {
        fVar48 = 1.0 - fVar65;
        auVar49._0_4_ = fVar65 * (pAVar29->l).vx.field_0.m128[0];
        auVar49._4_4_ = fVar65 * (pAVar29->l).vx.field_0.m128[1];
        auVar49._8_4_ = fVar65 * (pAVar29->l).vx.field_0.m128[2];
        auVar49._12_4_ = fVar65 * (pAVar29->l).vx.field_0.m128[3];
        auVar61._4_4_ = fVar48;
        auVar61._0_4_ = fVar48;
        auVar61._8_4_ = fVar48;
        auVar61._12_4_ = fVar48;
        auVar39 = vfmadd231ps_fma(auVar49,auVar61,(undefined1  [16])(pAVar27->l).vx.field_0);
        auVar51._0_4_ = fVar65 * (pAVar29->l).vy.field_0.m128[0];
        auVar51._4_4_ = fVar65 * (pAVar29->l).vy.field_0.m128[1];
        auVar51._8_4_ = fVar65 * (pAVar29->l).vy.field_0.m128[2];
        auVar51._12_4_ = fVar65 * (pAVar29->l).vy.field_0.m128[3];
        auVar38 = vfmadd231ps_fma(auVar51,auVar61,(undefined1  [16])(pAVar27->l).vy.field_0);
        auVar59._0_4_ = fVar65 * (pAVar29->l).vz.field_0.m128[0];
        auVar59._4_4_ = fVar65 * (pAVar29->l).vz.field_0.m128[1];
        auVar59._8_4_ = fVar65 * (pAVar29->l).vz.field_0.m128[2];
        auVar59._12_4_ = fVar65 * (pAVar29->l).vz.field_0.m128[3];
        auVar37 = vfmadd231ps_fma(auVar59,auVar61,(undefined1  [16])(pAVar27->l).vz.field_0);
        auVar55._0_4_ = fVar65 * (pAVar29->p).field_0.m128[0];
        auVar55._4_4_ = fVar65 * (pAVar29->p).field_0.m128[1];
        auVar55._8_4_ = fVar65 * (pAVar29->p).field_0.m128[2];
        auVar55._12_4_ = fVar65 * (pAVar29->p).field_0.m128[3];
        auVar33 = vfmadd231ps_fma(auVar55,auVar61,(undefined1  [16])(pAVar27->p).field_0);
      }
      auVar34 = vshufps_avx(auVar37,auVar37,0xc9);
      auVar35 = vshufps_avx(auVar38,auVar38,0xc9);
      auVar68._0_4_ = auVar37._0_4_ * auVar35._0_4_;
      auVar68._4_4_ = auVar37._4_4_ * auVar35._4_4_;
      auVar68._8_4_ = auVar37._8_4_ * auVar35._8_4_;
      auVar68._12_4_ = auVar37._12_4_ * auVar35._12_4_;
      auVar36 = vfmsub231ps_fma(auVar68,auVar38,auVar34);
      auVar40 = vshufps_avx(auVar36,auVar36,0xc9);
      auVar41 = vshufps_avx(auVar39,auVar39,0xc9);
      auVar62._0_4_ = auVar39._0_4_ * auVar34._0_4_;
      auVar62._4_4_ = auVar39._4_4_ * auVar34._4_4_;
      auVar62._8_4_ = auVar39._8_4_ * auVar34._8_4_;
      auVar62._12_4_ = auVar39._12_4_ * auVar34._12_4_;
      auVar50 = vfmsub231ps_fma(auVar62,auVar41,auVar37);
      auVar52._0_4_ = auVar41._0_4_ * auVar38._0_4_;
      auVar52._4_4_ = auVar41._4_4_ * auVar38._4_4_;
      auVar52._8_4_ = auVar41._8_4_ * auVar38._8_4_;
      auVar52._12_4_ = auVar41._12_4_ * auVar38._12_4_;
      auVar37 = vfmsub231ps_fma(auVar52,auVar39,auVar35);
      auVar34 = vshufps_avx(auVar37,auVar37,0xc9);
      auVar35 = vunpcklps_avx(auVar40,auVar34);
      auVar37 = vunpcklps_avx(auVar36,auVar37);
      auVar34 = vinsertps_avx(auVar50,auVar50,0x4a);
      auVar37 = vunpcklps_avx(auVar37,ZEXT416(auVar50._0_4_));
      auVar38 = vunpcklps_avx(auVar35,auVar34);
      auVar35 = vunpckhps_avx(auVar35,auVar34);
      auVar34 = vdpps_avx(auVar39,auVar40,0x7f);
      uVar47 = auVar34._0_4_;
      auVar66._4_4_ = uVar47;
      auVar66._0_4_ = uVar47;
      auVar66._8_4_ = uVar47;
      auVar66._12_4_ = uVar47;
      aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vdivps_avx(auVar38,auVar66);
      aVar7 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vdivps_avx(auVar35,auVar66);
      aVar8 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vdivps_avx(auVar37,auVar66);
      uVar47 = auVar33._0_4_;
      auVar63._4_4_ = uVar47;
      auVar63._0_4_ = uVar47;
      auVar63._8_4_ = uVar47;
      auVar63._12_4_ = uVar47;
      auVar34 = vshufps_avx(auVar33,auVar33,0x55);
      auVar35 = vshufps_avx(auVar33,auVar33,0xaa);
      auVar56._0_4_ = auVar35._0_4_ * aVar8.m128[0];
      auVar56._4_4_ = auVar35._4_4_ * aVar8.m128[1];
      auVar56._8_4_ = auVar35._8_4_ * aVar8.m128[2];
      auVar56._12_4_ = auVar35._12_4_ * aVar8.m128[3];
      auVar34 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar7,auVar34);
      auVar34 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar6,auVar63);
      auVar23._8_4_ = 0x80000000;
      auVar23._0_8_ = 0x8000000080000000;
      auVar23._12_4_ = 0x80000000;
      aVar32 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vxorps_avx512vl(auVar34,auVar23);
    }
    auVar34 = *(undefined1 (*) [16])(ray->org).field_0.m128;
    auVar35 = *(undefined1 (*) [16])(ray->dir).field_0.m128;
    uVar47 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
    auVar17._4_4_ = uVar47;
    auVar17._0_4_ = uVar47;
    auVar17._8_4_ = uVar47;
    auVar17._12_4_ = uVar47;
    auVar33 = vfmadd231ps_avx512vl((undefined1  [16])aVar32,(undefined1  [16])aVar8,auVar17);
    uVar47 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
    auVar18._4_4_ = uVar47;
    auVar18._0_4_ = uVar47;
    auVar18._8_4_ = uVar47;
    auVar18._12_4_ = uVar47;
    auVar33 = vfmadd231ps_avx512vl(auVar33,(undefined1  [16])aVar7,auVar18);
    uVar47 = *(undefined4 *)&(ray->org).field_0;
    auVar19._4_4_ = uVar47;
    auVar19._0_4_ = uVar47;
    auVar19._8_4_ = uVar47;
    auVar19._12_4_ = uVar47;
    auVar33 = vfmadd231ps_avx512vl(auVar33,(undefined1  [16])aVar6,auVar19);
    aVar13 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vblendps_avx(auVar33,auVar34,8);
    (ray->org).field_0 = aVar13;
    uVar47 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
    auVar20._4_4_ = uVar47;
    auVar20._0_4_ = uVar47;
    auVar20._8_4_ = uVar47;
    auVar20._12_4_ = uVar47;
    auVar33 = vmulps_avx512vl((undefined1  [16])aVar8,auVar20);
    uVar47 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
    auVar21._4_4_ = uVar47;
    auVar21._0_4_ = uVar47;
    auVar21._8_4_ = uVar47;
    auVar21._12_4_ = uVar47;
    auVar33 = vfmadd231ps_avx512vl(auVar33,(undefined1  [16])aVar7,auVar21);
    uVar47 = *(undefined4 *)&(ray->dir).field_0;
    auVar22._4_4_ = uVar47;
    auVar22._0_4_ = uVar47;
    auVar22._8_4_ = uVar47;
    auVar22._12_4_ = uVar47;
    auVar33 = vfmadd231ps_avx512vl(auVar33,(undefined1  [16])aVar6,auVar22);
    aVar13 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vblendps_avx(auVar33,auVar35,8);
    (ray->dir).field_0 = aVar13;
    lVar11 = *(long *)&(pIVar9->super_Geometry).field_0x58;
    (**(code **)(lVar11 + 0x80))(lVar11 + 0x58,ray);
    local_a8 = auVar34._0_8_;
    uStack_a0 = auVar34._8_8_;
    *(undefined8 *)&(ray->org).field_0 = local_a8;
    *(undefined8 *)((long)&(ray->org).field_0 + 8) = uStack_a0;
    local_b8 = auVar35._0_8_;
    uStack_b0 = auVar35._8_8_;
    *(undefined8 *)&(ray->dir).field_0 = local_b8;
    *(undefined8 *)((long)&(ray->dir).field_0 + 8) = uStack_b0;
    bVar24 = ray->tfar < 0.0;
    pRVar10->instID[0] = 0xffffffff;
    pRVar10->instPrimID[0] = 0xffffffff;
  }
  return bVar24;
}

Assistant:

bool InstanceIntersector1MB::occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const InstancePrimitive& prim)
    {
      const Instance* instance = prim.instance;
      
      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return false;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      bool occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, 0)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(ray.time());
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)instance->object, user_context, context->args);
        instance->object->intersectors.occluded((RTCRay&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);      
      }
      return occluded;
    }